

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleCreateLinkCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string *filename;
  string *filename_00;
  pointer pbVar1;
  pointer pbVar2;
  size_t __n;
  cmMakefile *this_00;
  bool bVar3;
  int iVar4;
  long *plVar5;
  ostream *poVar6;
  offset_in_Arguments_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin0;
  pointer pbVar9;
  string_view arg;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  string result;
  Arguments arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  undefined2 local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  undefined1 local_1a8 [8];
  pointer ppStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_198 [6];
  ios_base local_138 [264];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    local_1a8 = (undefined1  [8])aaStack_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "CREATE_LINK must be called with at least two additional arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])aaStack_198) {
      operator_delete((void *)local_1a8,aaStack_198[0]._M_allocated_capacity + 1);
    }
    return false;
  }
  if ((HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::parser == '\0') &&
     (iVar4 = __cxa_guard_acquire(&HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::parser), iVar4 != 0)) {
    local_1a8 = (undefined1  [8])0x0;
    ppStack_1a0 = (pointer)0x0;
    aaStack_198[0]._M_allocated_capacity = 0;
    name.super_string_view._M_str = "RESULT";
    name.super_string_view._M_len = 6;
    cmArgumentParser<cmFileCommand::HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmFileCommand::HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                *)local_1a8,name,in_RCX);
    name_00.super_string_view._M_str = "COPY_ON_ERROR";
    name_00.super_string_view._M_len = 0xd;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_1a8,name_00,0x20);
    name_01.super_string_view._M_str = "SYMBOLIC";
    name_01.super_string_view._M_len = 8;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_1a8,name_01,0x21);
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
              *)&HandleCreateLinkCommand::parser,
             (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
              *)local_1a8);
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
               *)local_1a8);
    __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleCreateLinkCommand::parser,
                 &__dso_handle);
    __cxa_guard_release(&HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::parser);
  }
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + 3;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  local_1d0 = 0;
  local_1a8 = (undefined1  [8])&HandleCreateLinkCommand::parser;
  ppStack_1a0 = (pointer)0x0;
  aaStack_198[0]._M_allocated_capacity = 0;
  aaStack_198[0]._8_8_ = aaStack_198[0]._8_8_ & 0xffffffffffffff00;
  if (pbVar9 != pbVar2) {
    do {
      arg._M_str = (pbVar9->_M_dataplus)._M_p;
      arg._M_len = pbVar9->_M_string_length;
      ArgumentParser::Instance::Consume
                ((Instance *)local_1a8,arg,&local_1f0,&local_1c8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar2);
    if (local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::operator+(&local_210,"unknown argument: \"",
                     local_1c8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      plVar5 = (long *)std::__cxx11::string::_M_replace_aux
                                 ((ulong)&local_210,local_210._M_string_length,0,'\x01');
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar7) {
        aaStack_198[0]._0_8_ = paVar7->_M_allocated_capacity;
        aaStack_198[0]._8_8_ = plVar5[3];
        local_1a8 = (undefined1  [8])aaStack_198;
      }
      else {
        aaStack_198[0]._0_8_ = paVar7->_M_allocated_capacity;
        local_1a8 = (undefined1  [8])*plVar5;
      }
      ppStack_1a0 = (pointer)plVar5[1];
      *plVar5 = (long)paVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
      if (local_1a8 != (undefined1  [8])aaStack_198) {
        operator_delete((void *)local_1a8,aaStack_198[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                                 local_210.field_2._M_local_buf[0]) + 1);
      }
      bVar3 = false;
      goto LAB_001be7b5;
    }
  }
  filename = pbVar1 + 1;
  filename_00 = pbVar1 + 2;
  paVar7 = &local_210.field_2;
  local_210._M_string_length = 0;
  local_210.field_2._M_local_buf[0] = '\0';
  __n = pbVar1[1]._M_string_length;
  local_210._M_dataplus._M_p = (pointer)paVar7;
  if ((__n == pbVar1[2]._M_string_length) &&
     ((__n == 0 ||
      (iVar4 = bcmp((filename->_M_dataplus)._M_p,(filename_00->_M_dataplus)._M_p,__n), iVar4 == 0)))
     ) {
    std::__cxx11::string::_M_replace((ulong)&local_210,0,(char *)0x0,0x4e44dc);
LAB_001be75a:
    if (local_1f0._M_string_length == 0) {
      cmCommand::SetError(&this->super_cmCommand,&local_210);
LAB_001be79c:
      bVar3 = false;
    }
    else {
      bVar3 = true;
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,&local_1f0,local_210._M_dataplus._M_p);
    }
  }
  else {
    if ((local_1d0._1_1_ == '\0') && (bVar3 = cmsys::SystemTools::FileExists(filename), !bVar3)) {
      std::operator+(&local_230,"Cannot hard link \'",filename);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_230);
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar8) {
        aaStack_198[0]._0_8_ = paVar8->_M_allocated_capacity;
        aaStack_198[0]._8_8_ = plVar5[3];
        local_1a8 = (undefined1  [8])aaStack_198;
      }
      else {
        aaStack_198[0]._0_8_ = paVar8->_M_allocated_capacity;
        local_1a8 = (undefined1  [8])*plVar5;
      }
      ppStack_1a0 = (pointer)plVar5[1];
      *plVar5 = (long)paVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_210,(string *)local_1a8);
      if (local_1a8 != (undefined1  [8])aaStack_198) {
        operator_delete((void *)local_1a8,aaStack_198[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001be75a;
    }
    bVar3 = cmsys::SystemTools::FileExists(filename_00);
    if (((!bVar3) && (bVar3 = cmsys::SystemTools::FileIsSymlink(filename_00), !bVar3)) ||
       (bVar3 = cmsys::SystemTools::RemoveFile(filename_00), bVar3)) {
      if (local_1d0._1_1_ == '\x01') {
        bVar3 = cmSystemTools::CreateSymlink(filename,filename_00,&local_210);
      }
      else {
        bVar3 = cmSystemTools::CreateLink(filename,filename_00,&local_210);
      }
      if (bVar3 != false) {
LAB_001be5af:
        std::__cxx11::string::_M_replace
                  ((ulong)&local_210,0,(char *)local_210._M_string_length,0x536c8a);
        if (local_1f0._M_string_length == 0) {
          bVar3 = true;
        }
        else {
LAB_001be679:
          bVar3 = true;
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,&local_1f0,local_210._M_dataplus._M_p);
        }
        goto LAB_001be79e;
      }
      if ((char)local_1d0 == '\x01') {
        bVar3 = cmsys::SystemTools::CopyFileAlways(filename,filename_00);
        if (bVar3) goto LAB_001be5af;
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,"Copy failed: ",&local_230);
        std::__cxx11::string::operator=((string *)&local_210,(string *)local_1a8);
        if (local_1a8 != (undefined1  [8])aaStack_198) {
          operator_delete((void *)local_1a8,aaStack_198[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_1f0._M_string_length != 0) goto LAB_001be679;
      cmCommand::SetError(&this->super_cmCommand,&local_210);
      goto LAB_001be79c;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Failed to create link \'",0x17);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,pbVar1[2]._M_dataplus._M_p,pbVar1[2]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\' because existing path cannot be removed: ",0x2b);
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    bVar3 = local_1f0._M_string_length != 0;
    if (local_1f0._M_string_length == 0) {
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_230);
    }
    else {
      this_00 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::AddDefinition(this_00,&local_1f0,local_230._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
LAB_001be79e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar7) {
    operator_delete(local_210._M_dataplus._M_p,
                    CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                             local_210.field_2._M_local_buf[0]) + 1);
  }
LAB_001be7b5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  return bVar3;
}

Assistant:

bool cmFileCommand::HandleCreateLinkCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError("CREATE_LINK must be called with at least two additional "
                   "arguments");
    return false;
  }

  std::string const& fileName = args[1];
  std::string const& newFileName = args[2];

  struct Arguments
  {
    std::string Result;
    bool CopyOnError = false;
    bool Symbolic = false;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("RESULT"_s, &Arguments::Result)
      .Bind("COPY_ON_ERROR"_s, &Arguments::CopyOnError)
      .Bind("SYMBOLIC"_s, &Arguments::Symbolic);

  std::vector<std::string> unconsumedArgs;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unconsumedArgs);

  if (!unconsumedArgs.empty()) {
    this->SetError("unknown argument: \"" + unconsumedArgs.front() + '\"');
    return false;
  }

  // The system error message generated in the operation.
  std::string result;

  // Check if the paths are distinct.
  if (fileName == newFileName) {
    result = "CREATE_LINK cannot use same file and newfile";
    if (!arguments.Result.empty()) {
      this->Makefile->AddDefinition(arguments.Result, result.c_str());
      return true;
    }
    this->SetError(result);
    return false;
  }

  // Hard link requires original file to exist.
  if (!arguments.Symbolic && !cmSystemTools::FileExists(fileName)) {
    result = "Cannot hard link \'" + fileName + "\' as it does not exist.";
    if (!arguments.Result.empty()) {
      this->Makefile->AddDefinition(arguments.Result, result.c_str());
      return true;
    }
    this->SetError(result);
    return false;
  }

  // Check if the new file already exists and remove it.
  if ((cmSystemTools::FileExists(newFileName) ||
       cmSystemTools::FileIsSymlink(newFileName)) &&
      !cmSystemTools::RemoveFile(newFileName)) {
    std::ostringstream e;
    e << "Failed to create link '" << newFileName
      << "' because existing path cannot be removed: "
      << cmSystemTools::GetLastSystemError() << "\n";

    if (!arguments.Result.empty()) {
      this->Makefile->AddDefinition(arguments.Result, e.str().c_str());
      return true;
    }
    this->SetError(e.str());
    return false;
  }

  // Whether the operation completed successfully.
  bool completed = false;

  // Check if the command requires a symbolic link.
  if (arguments.Symbolic) {
    completed = cmSystemTools::CreateSymlink(fileName, newFileName, &result);
  } else {
    completed = cmSystemTools::CreateLink(fileName, newFileName, &result);
  }

  // Check if copy-on-error is enabled in the arguments.
  if (!completed && arguments.CopyOnError) {
    completed = cmsys::SystemTools::CopyFileAlways(fileName, newFileName);
    if (!completed) {
      result = "Copy failed: " + cmSystemTools::GetLastSystemError();
    }
  }

  // Check if the operation was successful.
  if (completed) {
    result = "0";
  } else if (arguments.Result.empty()) {
    // The operation failed and the result is not reported in a variable.
    this->SetError(result);
    return false;
  }

  if (!arguments.Result.empty()) {
    this->Makefile->AddDefinition(arguments.Result, result.c_str());
  }

  return true;
}